

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  bool bVar1;
  idx_t offset;
  idx_t iVar2;
  size_type sVar3;
  list_entry_t *this;
  anon_union_16_2_67f50693_for_value *paVar4;
  UnifiedVectorFormat *in_RDX;
  ulong in_RSI;
  Vector *in_RDI;
  pair<const_duckdb::string_t,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *__range3;
  list_entry_t *list_entry;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  list_entry_t *list_entries;
  Vector *child_elements;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  *state;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar5;
  UnifiedVectorFormat *this_00;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true> local_e8;
  _Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_long>,_true> local_e0;
  long local_d8;
  list_entry_t *local_d0;
  Allocator *local_c8;
  UnifiedVectorFormat *local_c0;
  UnifiedVectorFormat *local_b8;
  idx_t local_b0;
  list_entry_t *local_a8;
  undefined8 local_a0;
  Allocator *local_98;
  UnifiedVectorFormat *local_90;
  long local_88;
  idx_t local_80;
  OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *local_78;
  SelectionVector *local_60 [9];
  UnifiedVectorFormat *local_18;
  ulong local_10;
  Vector *local_8;
  
  this_00 = (UnifiedVectorFormat *)local_60;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_00);
  duckdb::Vector::ToUnifiedFormat(local_10,local_18);
  local_78 = (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              *)UnifiedVectorFormat::
                GetData<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>*>
                          ((UnifiedVectorFormat *)local_60);
  offset = duckdb::ListVector::GetListSize(local_8);
  local_88 = 0;
  local_80 = offset;
  for (local_90 = (UnifiedVectorFormat *)0x0; pOVar5 = local_78, local_90 < local_18;
      local_90 = local_90 + 1) {
    iVar2 = SelectionVector::get_index(local_60[0],(idx_t)local_90);
    local_98 = (&pOVar5->allocator)[iVar2];
    if (*(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
          **)&local_98->field_0x0 !=
        (OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *)0x0) {
      sVar3 = OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              ::size((OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                      *)0xd8eb3d);
      local_88 = sVar3 + local_88;
    }
  }
  duckdb::ListVector::Reserve(local_8,local_80 + local_88);
  local_a0 = duckdb::ListVector::GetEntry(local_8);
  this = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xd8ebb6);
  local_b0 = local_80;
  local_a8 = this;
  for (local_b8 = (UnifiedVectorFormat *)0x0; local_b8 < local_18; local_b8 = local_b8 + 1) {
    local_c0 = local_b8;
    pOVar5 = local_78;
    iVar2 = SelectionVector::get_index(local_60[0],(idx_t)local_b8);
    local_c8 = (&pOVar5->allocator)[iVar2];
    local_d0 = local_a8 + (long)local_c0;
    local_d0->offset = local_b0;
    if (*(long *)local_c8 == 0) {
      local_d0->length = 0;
    }
    else {
      local_d8 = *(long *)local_c8;
      local_e0._M_cur =
           (__node_type *)
           OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
           ::begin(pOVar5);
      local_e8._M_cur =
           (__node_type *)
           OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
           ::end(pOVar5);
      while (bVar1 = std::__detail::operator!=(&local_e0,&local_e8), bVar1) {
        paVar4 = (anon_union_16_2_67f50693_for_value *)
                 std::__detail::
                 _Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>::
                 operator*((_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>
                            *)0xd8ecca);
        FinalizeGenericValueFunctor::HistogramFinalize<duckdb::string_t>
                  ((string_t)paVar4->pointer,(Vector *)this_00,offset);
        local_b0 = local_b0 + 1;
        std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>
                      *)this);
      }
      local_d0->length = local_b0 - local_d0->offset;
    }
  }
  duckdb::ListVector::SetListSize(local_8,local_b0);
  duckdb::Vector::Verify((ulong)local_8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}